

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

fsg_link_t * fsg_model_null_trans(fsg_model_t *fsg,int32 i,int32 j)

{
  hash_table_t *h;
  int32 iVar1;
  int32 j_local;
  void *val;
  
  h = fsg->trans[i].null_trans;
  if ((h == (hash_table_t *)0x0) ||
     (j_local = j, iVar1 = hash_table_lookup_bkey(h,(char *)&j_local,4,&val), iVar1 < 0)) {
    val = (fsg_link_t *)0x0;
  }
  return (fsg_link_t *)val;
}

Assistant:

fsg_link_t *
fsg_model_null_trans(fsg_model_t * fsg, int32 i, int32 j)
{
    void *val;

    if (fsg->trans[i].null_trans == NULL)
        return NULL;
    if (hash_table_lookup_bkey(fsg->trans[i].null_trans, (char const *) &j,
                               sizeof(j), &val) < 0)
        return NULL;
    return (fsg_link_t *) val;
}